

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_after_frame_sent1(nghttp2_session *session)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  nghttp2_stream *pnVar4;
  nghttp2_session *session_00;
  long in_RDI;
  nghttp2_goaway_aux_data *aux_data_2;
  nghttp2_headers_aux_data *aux_data_1;
  int stream_closed;
  nghttp2_data_aux_data *aux_data;
  nghttp2_stream *stream;
  nghttp2_frame *frame;
  nghttp2_bufs *framebufs;
  nghttp2_outbound_item *item;
  nghttp2_active_outbound_item *aob;
  int rv;
  undefined4 in_stack_ffffffffffffff88;
  int32_t in_stack_ffffffffffffff8c;
  nghttp2_frame *in_stack_ffffffffffffff90;
  int32_t stream_id;
  nghttp2_session *in_stack_ffffffffffffff98;
  nghttp2_session *in_stack_ffffffffffffffa0;
  nghttp2_session *in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffb0;
  int32_t in_stack_ffffffffffffffb4;
  nghttp2_session *in_stack_ffffffffffffffb8;
  uint64_t *puVar5;
  nghttp2_session *session_01;
  nghttp2_session *pnVar6;
  nghttp2_stream_state initial_state;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  plVar3 = (long *)(in_RDI + 0x288);
  session_01 = (nghttp2_session *)*plVar3;
  if (*(char *)((long)&(session_01->streams).mem + 4) == '\0') {
    puVar5 = &(session_01->root).descendant_last_cycle;
    pnVar4 = nghttp2_session_get_stream
                       (in_stack_ffffffffffffff98,
                        (int32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    *(int *)(in_RDI + 0xb0c) = *(int *)(in_RDI + 0xb0c) - (int)(session_01->streams).table;
    if ((pnVar4 != (nghttp2_stream *)0x0) &&
       (pnVar4->remote_window_size = pnVar4->remote_window_size - (int)(session_01->streams).table,
       *(char *)((long)puVar5 + 0x19) != '\0')) {
      session_detach_stream_item
                ((nghttp2_session *)&in_stack_ffffffffffffff90->hd,
                 (nghttp2_stream *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (*(long *)(in_RDI + 0x968) != 0) {
        iVar1 = session_call_on_frame_send(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        iVar2 = nghttp2_is_fatal(iVar1);
        if (iVar2 != 0) {
          return iVar1;
        }
      }
      if (((ulong)(session_01->streams).mem & 0x10000000000) != 0) {
        nghttp2_stream_shutdown(pnVar4,NGHTTP2_SHUT_WR);
        iVar1 = nghttp2_session_close_stream_if_shut_rdwr
                          ((nghttp2_session *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           (nghttp2_stream *)0x110e40);
        iVar2 = nghttp2_is_fatal(iVar1);
        if (iVar2 != 0) {
          return iVar1;
        }
      }
      return 0;
    }
    if (*(long *)(in_RDI + 0x968) != 0) {
      iVar1 = session_call_on_frame_send(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      iVar2 = nghttp2_is_fatal(iVar1);
      if (iVar2 != 0) {
        return iVar1;
      }
    }
    return 0;
  }
  pnVar6 = session_01;
  if (((*(char *)((long)&(session_01->streams).mem + 4) == '\x01') ||
      (*(char *)((long)&(session_01->streams).mem + 4) == '\x05')) &&
     (iVar1 = nghttp2_bufs_next_present((nghttp2_bufs *)(in_RDI + 0x290)), iVar1 != 0)) {
    return 0;
  }
  initial_state = (nghttp2_stream_state)((ulong)plVar3 >> 0x20);
  iVar1 = session_call_on_frame_send(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  iVar2 = nghttp2_is_fatal(iVar1);
  if (iVar2 != 0) {
    return iVar1;
  }
  session_00 = (nghttp2_session *)(ulong)(*(byte *)((long)&(session_01->streams).mem + 4) - 1);
  stream_id = (int32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  switch(session_00) {
  case (nghttp2_session *)0x0:
    pnVar4 = nghttp2_session_get_stream(session_00,stream_id);
    if (pnVar4 == (nghttp2_stream *)0x0) {
      return 0;
    }
    switch((int)(session_01->root).obq.length) {
    case 0:
      break;
    case 2:
      pnVar4->flags = pnVar4->flags & 0xfe;
      *(long *)(in_RDI + 0xa88) = *(long *)(in_RDI + 0xa88) + 1;
    case 1:
      pnVar4->state = NGHTTP2_STREAM_OPENED;
    case 3:
      if (((ulong)(session_01->streams).mem & 0x10000000000) != 0) {
        nghttp2_stream_shutdown(pnVar4,NGHTTP2_SHUT_WR);
      }
      iVar1 = nghttp2_session_close_stream_if_shut_rdwr
                        ((nghttp2_session *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (nghttp2_stream *)0x1110f0);
      iVar2 = nghttp2_is_fatal(iVar1);
      if (iVar2 == 0) {
        if ((pnVar6->root).descendant_next_seq != 0) {
          iVar1 = nghttp2_submit_data_shared
                            (session_01,(uint8_t)((ulong)pnVar4 >> 0x38),(int32_t)pnVar4,
                             (nghttp2_data_provider_wrap *)in_stack_ffffffffffffffb8);
          iVar2 = nghttp2_is_fatal(iVar1);
          if (iVar2 != 0) {
            return iVar1;
          }
        }
        iVar1 = 0;
      }
      return iVar1;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                    ,0xbca,"int session_after_frame_sent1(nghttp2_session *)");
    }
  case (nghttp2_session *)0x1:
    if ((*(char *)(in_RDI + 0xb74) != '\0') || (*(char *)(in_RDI + 0xb72) == '\x01')) {
      return 0;
    }
    pnVar4 = nghttp2_session_get_stream_raw
                       ((nghttp2_session *)&in_stack_ffffffffffffff90->hd,in_stack_ffffffffffffff8c)
    ;
    if (pnVar4 == (nghttp2_stream *)0x0) {
      iVar2 = session_detect_idle_stream
                        ((nghttp2_session *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
      if (iVar2 == 0) {
        return 0;
      }
      pnVar4 = nghttp2_session_open_stream
                         ((nghttp2_session *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (int32_t)((ulong)in_RDI >> 0x20),(uint8_t)((ulong)in_RDI >> 0x18),
                          (nghttp2_priority_spec *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),
                          initial_state,pnVar6);
      if (pnVar4 == (nghttp2_stream *)0x0) {
        return -0x385;
      }
    }
    else {
      iVar1 = nghttp2_session_reprioritize_stream
                        (in_stack_ffffffffffffffb8,
                         (nghttp2_stream *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (nghttp2_priority_spec *)in_stack_ffffffffffffffa8);
      iVar2 = nghttp2_is_fatal(iVar1);
      if (iVar2 != 0) {
        return iVar1;
      }
    }
    iVar1 = nghttp2_session_adjust_idle_stream(in_stack_ffffffffffffffa8);
    iVar2 = nghttp2_is_fatal(iVar1);
    if (iVar2 != 0) {
      return iVar1;
    }
    return 0;
  case (nghttp2_session *)0x2:
    iVar1 = nghttp2_session_close_stream
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0
                      );
    iVar2 = nghttp2_is_fatal(iVar1);
    if (iVar2 != 0) {
      return iVar1;
    }
    return 0;
  default:
    return 0;
  case (nghttp2_session *)0x6:
    puVar5 = &(pnVar6->root).descendant_last_cycle;
    if ((*puVar5 & 2) == 0) {
      if ((*puVar5 & 1) != 0) {
        *(byte *)(in_RDI + 0xb75) = *(byte *)(in_RDI + 0xb75) | 2;
      }
      *(byte *)(in_RDI + 0xb75) = *(byte *)(in_RDI + 0xb75) | 4;
      iVar1 = session_close_stream_on_goaway
                        (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                         in_stack_ffffffffffffffb0);
      iVar2 = nghttp2_is_fatal(iVar1);
      if (iVar2 != 0) {
        return iVar1;
      }
    }
    return 0;
  case (nghttp2_session *)0x7:
    goto switchD_00110f64_caseD_7;
  }
  pnVar4->state = NGHTTP2_STREAM_OPENING;
  if (((ulong)(session_01->streams).mem & 0x10000000000) != 0) {
    nghttp2_stream_shutdown(pnVar4,NGHTTP2_SHUT_WR);
  }
  iVar1 = nghttp2_session_close_stream_if_shut_rdwr
                    ((nghttp2_session *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (nghttp2_stream *)0x110ffc);
  iVar2 = nghttp2_is_fatal(iVar1);
  if (iVar2 != 0) {
    return iVar1;
  }
  if ((pnVar6->root).descendant_next_seq != 0) {
    iVar1 = nghttp2_submit_data_shared
                      (session_01,(uint8_t)((ulong)pnVar4 >> 0x38),(int32_t)pnVar4,
                       (nghttp2_data_provider_wrap *)in_stack_ffffffffffffffb8);
    iVar2 = nghttp2_is_fatal(iVar1);
    if (iVar2 != 0) {
      return iVar1;
    }
  }
  return 0;
switchD_00110f64_caseD_7:
  if (*(int *)&(session_01->streams).mem == 0) {
    *(undefined1 *)(in_RDI + 0xb76) = 0;
    if ((*(uint *)(in_RDI + 0xb64) & 1) == 0) {
      iVar1 = nghttp2_session_update_recv_connection_window_size
                        (session_00,(size_t)in_stack_ffffffffffffff90);
    }
    else {
      iVar1 = session_update_connection_consumed_size
                        ((nghttp2_session *)&in_stack_ffffffffffffff90->hd,
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    iVar2 = nghttp2_is_fatal(iVar1);
    if (iVar2 != 0) {
      return iVar1;
    }
    return 0;
  }
  pnVar4 = nghttp2_session_get_stream(session_00,stream_id);
  if (pnVar4 == (nghttp2_stream *)0x0) {
    return 0;
  }
  pnVar4->window_update_queued = '\0';
  if ((pnVar4->shut_flags & 1) != 0) {
    return 0;
  }
  if ((*(uint *)(in_RDI + 0xb64) & 1) == 0) {
    iVar1 = nghttp2_session_update_recv_stream_window_size
                      (session_00,(nghttp2_stream *)&in_stack_ffffffffffffff90->hd,
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
  }
  else {
    iVar1 = session_update_stream_consumed_size
                      (in_stack_ffffffffffffffa0,(nghttp2_stream *)session_00,
                       (size_t)in_stack_ffffffffffffff90);
  }
  iVar2 = nghttp2_is_fatal(iVar1);
  if (iVar2 != 0) {
    return iVar1;
  }
  return 0;
}

Assistant:

static int session_after_frame_sent1(nghttp2_session *session) {
  int rv;
  nghttp2_active_outbound_item *aob = &session->aob;
  nghttp2_outbound_item *item = aob->item;
  nghttp2_bufs *framebufs = &aob->framebufs;
  nghttp2_frame *frame;
  nghttp2_stream *stream;

  frame = &item->frame;

  if (frame->hd.type == NGHTTP2_DATA) {
    nghttp2_data_aux_data *aux_data;

    aux_data = &item->aux_data.data;

    stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
    /* We update flow control window after a frame was completely
       sent. This is possible because we choose payload length not to
       exceed the window */
    session->remote_window_size -= (int32_t)frame->hd.length;
    if (stream) {
      stream->remote_window_size -= (int32_t)frame->hd.length;
    }

    if (stream && aux_data->eof) {
      session_detach_stream_item(session, stream);

      /* Call on_frame_send_callback after
         nghttp2_stream_detach_item(), so that application can issue
         nghttp2_submit_data2() in the callback. */
      if (session->callbacks.on_frame_send_callback) {
        rv = session_call_on_frame_send(session, frame);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
      }

      if (frame->hd.flags & NGHTTP2_FLAG_END_STREAM) {
        int stream_closed;

        stream_closed =
          (stream->shut_flags & NGHTTP2_SHUT_RDWR) == NGHTTP2_SHUT_RDWR;

        nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_WR);

        rv = nghttp2_session_close_stream_if_shut_rdwr(session, stream);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        /* stream may be NULL if it was closed */
        if (stream_closed) {
          stream = NULL;
        }
      }
      return 0;
    }

    if (session->callbacks.on_frame_send_callback) {
      rv = session_call_on_frame_send(session, frame);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
    }

    return 0;
  }

  /* non-DATA frame */

  if (frame->hd.type == NGHTTP2_HEADERS ||
      frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    if (nghttp2_bufs_next_present(framebufs)) {
      DEBUGF("send: CONTINUATION exists, just return\n");
      return 0;
    }
  }
  rv = session_call_on_frame_send(session, frame);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }
  switch (frame->hd.type) {
  case NGHTTP2_HEADERS: {
    nghttp2_headers_aux_data *aux_data;

    stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
    if (!stream) {
      return 0;
    }

    switch (frame->headers.cat) {
    case NGHTTP2_HCAT_REQUEST: {
      stream->state = NGHTTP2_STREAM_OPENING;
      if (frame->hd.flags & NGHTTP2_FLAG_END_STREAM) {
        nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_WR);
      }
      rv = nghttp2_session_close_stream_if_shut_rdwr(session, stream);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
      /* We assume aux_data is a pointer to nghttp2_headers_aux_data */
      aux_data = &item->aux_data.headers;
      if (aux_data->dpw.data_prd.read_callback) {
        /* nghttp2_submit_data_shared() makes a copy of
           aux_data->dpw */
        rv = nghttp2_submit_data_shared(session, NGHTTP2_FLAG_END_STREAM,
                                        frame->hd.stream_id, &aux_data->dpw);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        /* TODO nghttp2_submit_data_shared() may fail if stream has
           already DATA frame item.  We might have to handle it
           here. */
      }
      return 0;
    }
    case NGHTTP2_HCAT_PUSH_RESPONSE:
      stream->flags = (uint8_t)(stream->flags & ~NGHTTP2_STREAM_FLAG_PUSH);
      ++session->num_outgoing_streams;
    /* Fall through */
    case NGHTTP2_HCAT_RESPONSE:
      stream->state = NGHTTP2_STREAM_OPENED;
    /* Fall through */
    case NGHTTP2_HCAT_HEADERS:
      if (frame->hd.flags & NGHTTP2_FLAG_END_STREAM) {
        nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_WR);
      }
      rv = nghttp2_session_close_stream_if_shut_rdwr(session, stream);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
      /* We assume aux_data is a pointer to nghttp2_headers_aux_data */
      aux_data = &item->aux_data.headers;
      if (aux_data->dpw.data_prd.read_callback) {
        rv = nghttp2_submit_data_shared(session, NGHTTP2_FLAG_END_STREAM,
                                        frame->hd.stream_id, &aux_data->dpw);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        /* TODO nghttp2_submit_data_shared() may fail if stream has
           already DATA frame item.  We might have to handle it
           here. */
      }
      return 0;
    default:
      /* Unreachable */
      assert(0);
      return 0;
    }
  }
  case NGHTTP2_PRIORITY:
    if (session->server || session->pending_no_rfc7540_priorities == 1) {
      return 0;
    }

    stream = nghttp2_session_get_stream_raw(session, frame->hd.stream_id);

    if (!stream) {
      if (!session_detect_idle_stream(session, frame->hd.stream_id)) {
        return 0;
      }

      stream = nghttp2_session_open_stream(
        session, frame->hd.stream_id, NGHTTP2_FLAG_NONE,
        &frame->priority.pri_spec, NGHTTP2_STREAM_IDLE, NULL);
      if (!stream) {
        return NGHTTP2_ERR_NOMEM;
      }
    } else {
      rv = nghttp2_session_reprioritize_stream(session, stream,
                                               &frame->priority.pri_spec);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
    }

    rv = nghttp2_session_adjust_idle_stream(session);

    if (nghttp2_is_fatal(rv)) {
      return rv;
    }

    return 0;
  case NGHTTP2_RST_STREAM:
    rv = nghttp2_session_close_stream(session, frame->hd.stream_id,
                                      frame->rst_stream.error_code);
    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
    return 0;
  case NGHTTP2_GOAWAY: {
    nghttp2_goaway_aux_data *aux_data;

    aux_data = &item->aux_data.goaway;

    if ((aux_data->flags & NGHTTP2_GOAWAY_AUX_SHUTDOWN_NOTICE) == 0) {
      if (aux_data->flags & NGHTTP2_GOAWAY_AUX_TERM_ON_SEND) {
        session->goaway_flags |= NGHTTP2_GOAWAY_TERM_SENT;
      }

      session->goaway_flags |= NGHTTP2_GOAWAY_SENT;

      rv = session_close_stream_on_goaway(session, frame->goaway.last_stream_id,
                                          1);

      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
    }

    return 0;
  }
  case NGHTTP2_WINDOW_UPDATE:
    if (frame->hd.stream_id == 0) {
      session->window_update_queued = 0;
      if (session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE) {
        rv = session_update_connection_consumed_size(session, 0);
      } else {
        rv = nghttp2_session_update_recv_connection_window_size(session, 0);
      }

      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      return 0;
    }

    stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
    if (!stream) {
      return 0;
    }

    stream->window_update_queued = 0;

    /* We don't have to send WINDOW_UPDATE if END_STREAM from peer
       is seen. */
    if (stream->shut_flags & NGHTTP2_SHUT_RD) {
      return 0;
    }

    if (session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE) {
      rv = session_update_stream_consumed_size(session, stream, 0);
    } else {
      rv =
        nghttp2_session_update_recv_stream_window_size(session, stream, 0, 1);
    }

    if (nghttp2_is_fatal(rv)) {
      return rv;
    }

    return 0;
  default:
    return 0;
  }
}